

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Statement * __thiscall soul::StructuralParser::getNoop(StructuralParser *this)

{
  NoopStatement *pNVar1;
  Statement *pSVar2;
  Context local_28;
  
  if ((this->noop).object == (NoopStatement *)0x0) {
    local_28.location.sourceCode.object = (SourceCodeText *)0x0;
    local_28.location.location.data = (char *)0x0;
    local_28.parentScope = (Scope *)0x0;
    pNVar1 = allocate<soul::AST::NoopStatement,soul::AST::Context>(this,&local_28);
    (this->noop).object = pNVar1;
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&local_28);
  }
  pSVar2 = &pool_ptr<soul::AST::NoopStatement>::operator*(&this->noop)->super_Statement;
  return pSVar2;
}

Assistant:

AST::Statement& getNoop()     { if (noop == nullptr) noop = allocate<AST::NoopStatement> (AST::Context()); return *noop; }